

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O0

char ** adjustFlags(char **FLAG,int height,int width,int imax,int jmax)

{
  char **ppcVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  char **in_RDI;
  int in_R8D;
  int l;
  int k;
  int j;
  int i;
  short average;
  char **newFLAG;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int iVar2;
  int local_30;
  short local_2a;
  char **local_8;
  
  local_8 = in_RDI;
  if ((in_RDI != (char **)0x0) &&
     (ppcVar1 = create2DIntegerField(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
     ppcVar1 != (char **)0x0)) {
    for (local_30 = 0; local_30 < in_ECX; local_30 = local_30 + 1) {
      for (iVar2 = 0; iVar2 < in_R8D; iVar2 = iVar2 + 1) {
        local_2a = 0;
        for (in_stack_ffffffffffffffc0 = (local_30 * in_EDX) / in_ECX;
            in_stack_ffffffffffffffc0 <= ((local_30 + 1) * in_EDX) / in_ECX;
            in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + 1) {
          for (in_stack_ffffffffffffffbc = (iVar2 * in_ESI) / in_R8D;
              in_stack_ffffffffffffffbc <= ((iVar2 + 1) * in_ESI) / in_R8D;
              in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1) {
            if ((in_stack_ffffffffffffffc0 != in_EDX) && (in_stack_ffffffffffffffbc != in_ESI)) {
              local_2a = local_2a + in_RDI[in_stack_ffffffffffffffc0][in_stack_ffffffffffffffbc];
            }
          }
          in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffbc;
        }
        if ((in_EDX * in_ESI) / (in_ECX * in_R8D * 2) < (int)local_2a) {
          ppcVar1[local_30][iVar2] = '\0';
        }
        else {
          ppcVar1[local_30][iVar2] = '\x0f';
        }
      }
    }
    destroy2Dfield((void **)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc);
    local_8 = ppcVar1;
  }
  return local_8;
}

Assistant:

char** adjustFlags (char **FLAG, int height, int width, int imax, int jmax)
{
	/* Adjust the number of cells to a predefined number */
	if (FLAG == NULL)
		return FLAG;
	char **newFLAG = create2DIntegerField(imax,jmax);
	if (newFLAG == NULL)
		return FLAG;
	short average;
	for (int i = 0; i < imax; i++)
	{
		for (int j = 0; j < jmax; j++)
		{
			average = 0;
			for (int k = (i*width)/imax; k <= ((i+1)*width)/imax; k++)
				for (int l = (j*height)/jmax; l <= ((j+1)*height)/jmax; l++)
				{
					if (k == width || l == height)
						continue;
					average += FLAG[k][l];
				}
			if (average > (width*height)/(imax*jmax*2))
				newFLAG[i][j] = C_B;
			else
				newFLAG[i][j] = C_F;
		}
	}
	destroy2Dfield((void**)FLAG,width);
	return newFLAG;
}